

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeFactorable(Parse *pParse,Expr *pExpr,int target)

{
  Walker WStack_48;
  
  if (pParse->okConstFactor != '\0') {
    WStack_48.eCode = '\x02';
    WStack_48.xExprCallback = exprNodeIsConstant;
    WStack_48.xSelectCallback = sqlite3SelectWalkFail;
    WStack_48.u.n = 0;
    if (pExpr != (Expr *)0x0) {
      walkExpr(&WStack_48,pExpr);
    }
    if (WStack_48.eCode != '\0') {
      sqlite3ExprCodeAtInit(pParse,pExpr,target);
      return;
    }
  }
  sqlite3ExprCode(pParse,pExpr,target);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeFactorable(Parse *pParse, Expr *pExpr, int target){
  if( pParse->okConstFactor && sqlite3ExprIsConstantNotJoin(pExpr) ){
    sqlite3ExprCodeAtInit(pParse, pExpr, target);
  }else{
    sqlite3ExprCode(pParse, pExpr, target);
  }
}